

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O0

void __thiscall tcu::Matrix<float,_3,_3>::Matrix(Matrix<float,_3,_3> *this,Vector<float,_3> *src)

{
  float *pfVar1;
  float local_2c;
  int local_20;
  int local_1c;
  int col;
  int row;
  Vector<float,_3> *src_local;
  Matrix<float,_3,_3> *this_local;
  
  Vector<tcu::Vector<float,_3>,_3>::Vector(&this->m_data);
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
      if (local_1c == local_20) {
        local_2c = src->m_data[local_1c];
      }
      else {
        local_2c = 0.0;
      }
      pfVar1 = operator()(this,local_1c,local_20);
      *pfVar1 = local_2c;
    }
  }
  return;
}

Assistant:

Matrix<T, Rows, Cols>::Matrix (const Vector<T, Rows>& src)
{
	DE_STATIC_ASSERT(Rows == Cols);
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			(*this)(row, col) = (row == col) ? src.m_data[row] : T(0);
}